

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

int BN_set_word(BIGNUM *a,ulong w)

{
  BIGNUM *pBVar1;
  
  if ((a->dmax < 1) && (pBVar1 = bn_expand2(a,1), pBVar1 == (BIGNUM *)0x0)) {
    return 0;
  }
  a->neg = 0;
  *a->d = w;
  a->top = (uint)(w != 0);
  return 1;
}

Assistant:

int BN_set_word(BIGNUM *a, BN_ULONG w)
{
    bn_check_top(a);
    if (bn_expand(a, (int)sizeof(BN_ULONG) * 8) == NULL)
        return (0);
    a->neg = 0;
    a->d[0] = w;
    a->top = (w ? 1 : 0);
    bn_check_top(a);
    return (1);
}